

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rowSetTreeToList(RowSetEntry *pIn,RowSetEntry **ppFirst,RowSetEntry **ppLast)

{
  RowSetEntry **in_RDX;
  RowSetEntry *in_RSI;
  RowSetEntry *in_RDI;
  RowSetEntry *p;
  RowSetEntry **in_stack_ffffffffffffffe0;
  
  if (in_RDI->pLeft == (RowSetEntry *)0x0) {
    in_RSI->v = (i64)in_RDI;
  }
  else {
    rowSetTreeToList(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffe0[1] = in_RDI;
  }
  if (in_RDI->pRight == (RowSetEntry *)0x0) {
    *in_RDX = in_RDI;
  }
  else {
    rowSetTreeToList(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

static void rowSetTreeToList(
  struct RowSetEntry *pIn,         /* Root of the input tree */
  struct RowSetEntry **ppFirst,    /* Write head of the output list here */
  struct RowSetEntry **ppLast      /* Write tail of the output list here */
){
  assert( pIn!=0 );
  if( pIn->pLeft ){
    struct RowSetEntry *p;
    rowSetTreeToList(pIn->pLeft, ppFirst, &p);
    p->pRight = pIn;
  }else{
    *ppFirst = pIn;
  }
  if( pIn->pRight ){
    rowSetTreeToList(pIn->pRight, &pIn->pRight, ppLast);
  }else{
    *ppLast = pIn;
  }
  assert( (*ppLast)->pRight==0 );
}